

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_decoder.c
# Opt level: O2

_Bool lzma_lzma_lclppb_decode(lzma_options_lzma *options,uint8_t byte)

{
  byte bVar1;
  uint32_t uVar2;
  _Bool _Var3;
  
  _Var3 = true;
  if (byte < 0xe1) {
    options->pb = (uint)(byte / 0x2d);
    bVar1 = (byte % 0x2d) / 9;
    options->lp = (uint)bVar1;
    uVar2 = (uint)bVar1 * -9 + (uint)(byte % 0x2d);
    options->lc = uVar2;
    _Var3 = 4 < uVar2 + bVar1;
  }
  return _Var3;
}

Assistant:

extern bool
lzma_lzma_lclppb_decode(lzma_options_lzma *options, uint8_t byte)
{
	if (byte > (4 * 5 + 4) * 9 + 8)
		return true;

	// See the file format specification to understand this.
	options->pb = byte / (9 * 5);
	byte -= options->pb * 9 * 5;
	options->lp = byte / 9;
	options->lc = byte - options->lp * 9;

	return options->lc + options->lp > LZMA_LCLP_MAX;
}